

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

Token * __thiscall Tokenizer::parseName(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  _Storage<char,_true> __rhs;
  _Optional_payload_base<char> _Var3;
  int iVar4;
  const_iterator cVar5;
  TokenizerException *this_00;
  long *plVar6;
  uint uVar7;
  ulong uVar8;
  size_type *psVar9;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  *this_01;
  long lVar10;
  string res;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defaultMethods;
  undefined1 local_312;
  undefined1 local_311;
  key_type local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2d0;
  string local_298;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  long *local_1b8 [2];
  long local_1a8 [2];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_198;
  byte local_178;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_170;
  byte local_150;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_148;
  byte local_128;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_120;
  undefined1 auStack_100 [8];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_f8;
  undefined1 local_d8;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_d0;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_a8;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_80;
  byte local_60;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_58;
  byte local_38;
  
  _Var3._M_engaged = false;
  _Var3._M_payload._M_value = c;
  local_310._M_string_length = 0;
  local_310.field_2._M_local_buf[0] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  while ((__rhs = _Var3._M_payload, (byte)(__rhs._M_value + 0x9fU) < 0x1a ||
         (__rhs._M_value == '_' || (byte)(__rhs._M_value + 0xbfU) < 0x1a))) {
    std::__cxx11::string::push_back((char)&local_310);
    _Var3 = (_Optional_payload_base<char>)next(this);
    if (((ushort)_Var3 >> 8 & 1) == 0) {
      local_148._M_rest._0_8_ = (undefined8)((long)&local_148 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,local_310._M_dataplus._M_p,
                 local_310._M_dataplus._M_p + local_310._M_string_length);
      local_128 = 2;
      __return_storage_ptr__->type = Name;
      std::__detail::__variant::
      _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&__return_storage_ptr__->value,
                        (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&local_148._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
        ::_S_vtable._M_arr[local_128]._M_data)
                ((anon_class_1_0_00000001 *)&local_298,
                 (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  *)&local_148);
      local_128 = 0xff;
LAB_00108508:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,
                        CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                                 local_310.field_2._M_local_buf[0]) + 1);
      }
      return __return_storage_ptr__;
    }
  }
  this->col_number = this->col_number + -1;
  this->pos = this->pos + -1;
  if (local_310._M_string_length == 0) {
    this_00 = (TokenizerException *)__cxa_allocate_exception(0x10);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0,"Unexpected character \'","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d0,
                   &local_2f0,__rhs._M_value);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    local_298._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_298._M_dataplus._M_p == psVar9) {
      local_298.field_2._M_allocated_capacity = *psVar9;
      local_298.field_2._8_8_ = plVar6[3];
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar9;
    }
    local_298._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    TokenizerException::TokenizerException
              (this_00,&local_298,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(this_00,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_310);
  if (iVar4 == 0) {
    local_58._M_first._M_storage._0_1_ = 1;
    local_38 = 3;
    __return_storage_ptr__->type = Boolean;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&__return_storage_ptr__->value,
                      (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&local_58._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr[local_38]._M_data)
              ((anon_class_1_0_00000001 *)&local_298,
               (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)&local_58);
    local_38 = 0xff;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_310);
    if (iVar4 == 0) {
      local_80._M_first._M_storage._0_1_ = 0;
      local_60 = 3;
      __return_storage_ptr__->type = Boolean;
      std::__detail::__variant::
      _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&__return_storage_ptr__->value,
                        (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&local_80._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
        ::_S_vtable._M_arr[local_60]._M_data)
                ((anon_class_1_0_00000001 *)&local_298,
                 (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  *)&local_80);
      local_60 = 0xff;
    }
    else {
      iVar4 = std::__cxx11::string::compare((ulong)&local_310,0,(char *)0x2);
      if (iVar4 == 0) {
        std::__cxx11::string::substr((ulong)&local_298,(ulong)&local_310);
        local_198._M_rest._0_8_ = (undefined8)((long)&local_198 + 0x10);
        paVar1 = &local_298.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p == paVar1) {
          local_198._24_8_ = local_298.field_2._8_8_;
        }
        else {
          local_198._M_rest._0_8_ =
               (undefined8)(_Uninitialized<double,_true>)local_298._M_dataplus._M_p;
        }
        local_198._8_8_ = local_298._M_string_length;
        local_298._M_string_length = 0;
        local_298.field_2._M_allocated_capacity =
             local_298.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_178 = 2;
        __return_storage_ptr__->type = Method;
        local_298._M_dataplus._M_p = (pointer)paVar1;
        std::__detail::__variant::
        _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
        ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                           *)&__return_storage_ptr__->value,
                          (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                           *)&local_198._M_first);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
          ::_S_vtable._M_arr[local_178]._M_data)
                  ((anon_class_1_0_00000001 *)&local_2d0,
                   (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                    *)&local_198);
        local_178 = 0xff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar1) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"GET","");
        local_278[0] = local_268;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"POST","");
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"PUT","");
        local_238[0] = local_228;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"HEAD","");
        local_218[0] = local_208;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"OPTIONS","");
        local_1f8[0] = local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"DELETE","");
        local_1d8[0] = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"TRACE","");
        plVar6 = local_1a8;
        local_1b8[0] = plVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"CONNECT","");
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::_Hashtable<std::__cxx11::string_const*>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_2d0,&local_298,&local_198,0,&local_2f0,&local_311,&local_312);
        lVar10 = -0x100;
        do {
          if (plVar6 != (long *)plVar6[-2]) {
            operator_delete((long *)plVar6[-2],*plVar6 + 1);
          }
          plVar6 = plVar6 + -4;
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0);
        cVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&local_2d0,&local_310);
        if (cVar5.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          local_170._M_rest._0_8_ = (undefined8)((long)&local_170 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,local_310._M_dataplus._M_p,
                     local_310._M_dataplus._M_p + local_310._M_string_length);
          local_150 = 2;
          __return_storage_ptr__->type = Method;
          std::__detail::__variant::
          _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
          ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                             *)&__return_storage_ptr__->value,
                            (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                             *)&local_170._M_first);
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
            ::_S_vtable._M_arr[local_150]._M_data)
                    ((anon_class_1_0_00000001 *)&local_298,
                     (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                      *)&local_170);
          local_150 = 0xff;
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_2d0);
          goto LAB_00108508;
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_2d0);
        uVar8 = (ulong)this->pos;
        uVar2 = (this->program)._M_string_length;
        if (uVar8 < uVar2) {
          if (uVar8 + 1 < uVar2) {
            uVar7 = (byte)(this->program)._M_dataplus._M_p[uVar8 + 1] | 0x100;
          }
          else {
            uVar7 = 0;
          }
          if (uVar7 >> 8 == 0) {
            local_d0._M_rest._0_8_ = (undefined8)((long)&local_d0 + 0x10);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_310._M_dataplus._M_p,
                       local_310._M_dataplus._M_p + local_310._M_string_length);
            this_01 = &local_d0;
            goto LAB_00108ab5;
          }
          if (((this->program)._M_dataplus._M_p[uVar8] != '[') || (((ushort)uVar7 & 0xff) != 0x5b))
          {
            local_120._M_rest._0_8_ = (undefined8)((long)&local_120 + 0x10);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,local_310._M_dataplus._M_p,
                       local_310._M_dataplus._M_p + local_310._M_string_length);
            this_01 = &local_120;
            goto LAB_00108ab5;
          }
          iVar4 = 2;
          do {
            next(this);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          this->parsingHeaderBlock = true;
          std::__cxx11::string::_M_assign((string *)&this->header_block_name);
          local_f8._M_rest._0_8_ = (undefined8)((long)&local_f8 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_310._M_dataplus._M_p,
                     local_310._M_dataplus._M_p + local_310._M_string_length);
          this_01 = &local_f8;
          local_d8 = 2;
          __return_storage_ptr__->type = HeaderOpener;
        }
        else {
          local_a8._M_rest._0_8_ = (undefined8)((long)&local_a8 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,local_310._M_dataplus._M_p,
                     local_310._M_dataplus._M_p + local_310._M_string_length);
          this_01 = &local_a8;
LAB_00108ab5:
          *(undefined1 *)(this_01 + 1) = 2;
          __return_storage_ptr__->type = Name;
        }
        std::__detail::__variant::
        _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
        ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                           *)&__return_storage_ptr__->value,
                          (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                           *)&this_01->_M_first);
        std::__detail::__variant::
        _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
        ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                             *)&this_01->_M_first);
      }
    }
  }
  goto LAB_00108508;
}

Assistant:

Token Tokenizer::parseName(char c) {
    optional<char> _;
    string res;
    // while it's a valid name char
    while ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z') || c == '_') {
        res += c;
        _ = next();
        if (!_.has_value()) {
            return Token(Name, res);
        }
        c = _.value();
    }
    unnext();

    if (res.length() == 0) {
        throw TokenizerException(string("Unexpected character '") + c + "'", line_number, col_number, current_line);
    }

    if (res == "true")
        return Token(Boolean, true);
    else if (res == "false")
        return Token(Boolean, false);
    else {
        // Http Method parsing
        if (res.compare(0, 2, "M_") == 0) {
            return Token(Method, res.substr(2));
        }
        const unordered_set<string> defaultMethods =
                {"GET", "POST", "PUT", "HEAD", "OPTIONS", "DELETE", "TRACE", "CONNECT"};
        auto it = defaultMethods.find(res);
        if (it != defaultMethods.end()) {
            return Token(Method, res);
        }
    }

    _ = peek();
    if (!_.has_value()) {
        return Token(Name, res);
    }
    optional<char> _1 = peek(1);
    if (!_1.has_value()) {
        return Token(Name, res);
    }

    if (_.value() == '[' && _1.value() == '[') {
        next(2);
        parsingHeaderBlock = true;
        header_block_name = res;
        return Token(HeaderOpener, res);
    }
    return Token(Name, res);
}